

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void llb_buildsystem_destroy(llb_buildsystem_t *system)

{
  if (system != (llb_buildsystem_t *)0x0) {
    std::
    unique_ptr<llbuild::buildsystem::BuildSystemFrontend,_std::default_delete<llbuild::buildsystem::BuildSystemFrontend>_>
    ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildSystemFrontend,_std::default_delete<llbuild::buildsystem::BuildSystemFrontend>_>
                   *)(system + 0x1f0));
    if (*(long **)(system + 0x1e8) != (long *)0x0) {
      (**(code **)(**(long **)(system + 0x1e8) + 8))();
    }
    *(undefined8 *)(system + 0x1e8) = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(system + 0x1c0));
    std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::~vector
              ((vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_> *)
               (system + 0x1a8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(system + 0x188));
    if (*(llb_buildsystem_t **)(system + 0x150) != system + 0x160) {
      operator_delete(*(llb_buildsystem_t **)(system + 0x150),*(long *)(system + 0x160) + 1);
    }
    if (*(llb_buildsystem_t **)(system + 0x130) != system + 0x140) {
      operator_delete(*(llb_buildsystem_t **)(system + 0x130),*(long *)(system + 0x140) + 1);
    }
    if (*(llb_buildsystem_t **)(system + 0x110) != system + 0x120) {
      operator_delete(*(llb_buildsystem_t **)(system + 0x110),*(long *)(system + 0x120) + 1);
    }
    if (*(llb_buildsystem_t **)(system + 0xf0) != system + 0x100) {
      operator_delete(*(llb_buildsystem_t **)(system + 0xf0),*(long *)(system + 0x100) + 1);
    }
    operator_delete(system,0x1f8);
    return;
  }
  return;
}

Assistant:

void llb_buildsystem_destroy(llb_buildsystem_t* system) {
  delete (CAPIBuildSystem*)system;
}